

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall duckdb_parquet::ListType::write(ListType *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (char *)in_stack_ffffffffffffffb8);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x6f5e34);
  uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x6f5e52);
  uVar4 = uVar3 + uVar1 + uVar2;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x6f5e76);
  return (ulong)uVar4;
}

Assistant:

uint32_t ListType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ListType");

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}